

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNMemArgBase::adjust_for_dyn(CTPNMemArgBase *this,tcpn_dyncomp_info *info)

{
  _func_int **pp_Var1;
  long in_RSI;
  CTcPrsNode *in_RDI;
  
  if (*(int *)(in_RSI + 4) != 0) {
    err_throw(0);
  }
  pp_Var1 = in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
  in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  pp_Var1 = in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
  in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  pp_Var1 = in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  (**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNMemArgBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* don't allow in speculative mode due to possible side effects */
    if (info->speculative)
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* 
     *   adjust my object expression, property expression, and argument
     *   list 
     */
    obj_expr_ = obj_expr_->adjust_for_dyn(info);
    prop_expr_ = prop_expr_->adjust_for_dyn(info);
    arglist_->adjust_for_dyn(info);

    /* return myself otherwise unchanged */
    return this;
}